

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
Clear<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this,
          NoThrowHeapAllocator *allocator)

{
  DListNode<Memory::SegmentBase<Memory::VirtualAllocWrapper>_> *pDVar1;
  DListNode<Memory::SegmentBase<Memory::VirtualAllocWrapper>_> *obj;
  
  obj = (this->super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>).next.node;
  while (obj != (DListNode<Memory::SegmentBase<Memory::VirtualAllocWrapper>_> *)this) {
    pDVar1 = (obj->super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>).next.node
    ;
    Memory::
    DeleteObject<Memory::NoThrowHeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::SegmentBase<Memory::VirtualAllocWrapper>>>
              (allocator,obj);
    obj = pDVar1;
  }
  (this->super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>).next.list = this;
  (this->super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>).prev.list = this;
  (this->super_RealCount).count = 0;
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }